

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BorderAmounts::SerializeWithCachedSizes
          (BorderAmounts *this,CodedOutputStream *output)

{
  uint uVar1;
  BorderAmounts_EdgeSizes *value;
  undefined4 local_20;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  BorderAmounts *this_local;
  
  local_20 = 0;
  uVar1 = borderamounts_size(this);
  for (; local_20 < uVar1; local_20 = local_20 + 1) {
    value = borderamounts(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteMessage(10,&value->super_MessageLite,output);
  }
  return;
}

Assistant:

void BorderAmounts::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.BorderAmounts)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.BorderAmounts.EdgeSizes borderAmounts = 10;
  for (unsigned int i = 0, n = this->borderamounts_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, this->borderamounts(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.BorderAmounts)
}